

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_string_cmp_op(sexp ctx,sexp self,sexp_sint_t n,sexp str1,sexp str2,sexp ci)

{
  char *__s1;
  sexp_uint_t sVar1;
  size_t sVar2;
  int iVar3;
  sexp psVar4;
  size_t __n;
  long lVar5;
  char *__s2;
  
  if ((((ulong)str1 & 3) != 0) || (str1->tag != 9)) {
    psVar4 = sexp_type_exception(ctx,self,9,str1);
    return psVar4;
  }
  if ((((ulong)str2 & 3) == 0) && (str2->tag == 9)) {
    sVar1 = (str1->value).string.length;
    sVar2 = (str2->value).string.length;
    __n = sVar2;
    if ((long)sVar1 < (long)sVar2) {
      __n = sVar1;
    }
    __s1 = (((str1->value).type.name)->value).flonum_bits + 8 + (long)(str1->value).type.cpl;
    __s2 = (((str2->value).type.cpl)->value).flonum_bits +
           (long)(((str2->value).type.name)->value).flonum_bits;
    if (ci == (sexp)&DAT_0000003e) {
      iVar3 = strncmp(__s1,__s2,__n);
    }
    else {
      iVar3 = strncasecmp(__s1,__s2,__n);
    }
    lVar5 = sVar1 - sVar2;
    if (iVar3 != 0) {
      lVar5 = (long)iVar3;
    }
    return (sexp)(lVar5 * 2 + 1);
  }
  psVar4 = sexp_type_exception(ctx,self,9,str2);
  return psVar4;
}

Assistant:

sexp sexp_string_cmp_op (sexp ctx, sexp self, sexp_sint_t n, sexp str1, sexp str2, sexp ci) {
  sexp_sint_t len1, len2, len, diff;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str1);
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str2);
  len1 = sexp_string_size(str1);
  len2 = sexp_string_size(str2);
  len = ((len1<len2) ? len1 : len2);
  if (ci==SEXP_FALSE)
    diff = strncmp(sexp_string_data(str1), sexp_string_data(str2), len);
  else
    diff = strncasecmp(sexp_string_data(str1), sexp_string_data(str2), len);
  if (! diff)
    diff = len1 - len2;
  return sexp_make_fixnum(diff);
}